

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addresses.cpp
# Opt level: O2

UniValue * __thiscall
wallet::DescribeWalletAddressVisitor::operator()
          (UniValue *__return_storage_ptr__,DescribeWalletAddressVisitor *this,WitnessV1Taproot *id)

{
  long lVar1;
  string str;
  long in_FS_OFFSET;
  undefined1 in_stack_ffffffffffffffd9 [15];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str.field_2._1_15_ = in_stack_ffffffffffffffd9;
  str._0_17_ = ZEXT817(&stack0xffffffffffffffd8);
  UniValue::UniValue(__return_storage_ptr__,VOBJ,str);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue operator()(const WitnessV1Taproot& id) const { return UniValue(UniValue::VOBJ); }